

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O2

void __thiscall TestMustache::testConformance(TestMustache *this)

{
  int iVar1;
  undefined8 *puVar2;
  long *plVar3;
  PartialsHash partials;
  QVariantMap data;
  QString output;
  PartialMap partialsMap;
  QString expected;
  QString template_;
  QtVariantContext context;
  Renderer renderer;
  
  puVar2 = (undefined8 *)QTest::qData("data",8);
  data.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              )*puVar2;
  if (data.d.d !=
      (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
       *)0x0) {
    LOCK();
    *(int *)data.d.d = *(int *)data.d.d + 1;
    UNLOCK();
  }
  plVar3 = (long *)QTest::qData("template_",10);
  template_.d.d = (Data *)*plVar3;
  template_.d.ptr = (char16_t *)plVar3[1];
  template_.d.size = plVar3[2];
  if (template_.d.d != (Data *)0x0) {
    LOCK();
    ((template_.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((template_.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar1 = qMetaTypeId<QHash<QString,QString>>();
  plVar3 = (long *)QTest::qData("partials",iVar1);
  partials.d = (Data *)*plVar3;
  if ((partials.d != (Data *)0x0) &&
     (((partials.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((partials.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((partials.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  plVar3 = (long *)QTest::qData("expected",10);
  expected.d.d = (Data *)*plVar3;
  expected.d.ptr = (char16_t *)plVar3[1];
  expected.d.size = plVar3[2];
  if (expected.d.d != (Data *)0x0) {
    LOCK();
    ((expected.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((expected.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  Mustache::Renderer::Renderer(&renderer);
  Mustache::PartialMap::PartialMap(&partialsMap,&partials);
  ::QVariant::QVariant((QVariant *)&output,(QMap *)&data);
  Mustache::QtVariantContext::QtVariantContext
            (&context,(QVariant *)&output,&partialsMap.super_PartialResolver);
  ::QVariant::~QVariant((QVariant *)&output);
  Mustache::Renderer::render(&output,&renderer,&template_,&context.super_Context);
  QTest::qCompare(&output,&expected,"output","expected",
                  "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                  ,0x212);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&output.d);
  Mustache::QtVariantContext::~QtVariantContext(&context);
  Mustache::PartialMap::~PartialMap(&partialsMap);
  Mustache::Renderer::~Renderer(&renderer);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&expected.d);
  QHash<QString,_QString>::~QHash(&partials);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&template_.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&data.d);
  return;
}

Assistant:

void TestMustache::testConformance()
{
	QFETCH(QVariantMap, data);
	QFETCH(QString, template_);
	QFETCH(PartialsHash, partials);
	QFETCH(QString, expected);

	Mustache::Renderer renderer;
	Mustache::PartialMap partialsMap(partials);
	Mustache::QtVariantContext context(data, &partialsMap);

	QString output = renderer.render(template_, &context);

	QCOMPARE(output, expected);
}